

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

size_t rtosc_print_arg_val(rtosc_arg_val_t *arg,char *buffer,size_t bs,rtosc_print_options *opt,
                          int *cols_used,rtosc_arg_val_t *prev_arg_if_range)

{
  rtosc_arg_t *arg_00;
  _Bool _Var1;
  int _n2;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  size_t sVar6;
  ushort **ppuVar7;
  tm_conflict *__tp;
  uint64_t uVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  uint uVar12;
  byte *pbVar13;
  rtosc_arg_val_t *arg_01;
  rtosc_arg_val_t *prVar14;
  rtosc_arg_val_t *prev_arg_if_range_00;
  char *pcVar15;
  char *pcVar16;
  byte bVar17;
  undefined1 *opt_00;
  ulong uVar18;
  long lVar19;
  byte *pbVar20;
  bool bVar21;
  float fVar22;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [16];
  rtosc_arg_val_t second;
  rtosc_arg_val_t m_one;
  char fmtstr [9];
  int local_64;
  byte *local_60;
  char *local_50;
  size_t local_40;
  
  opt_00 = _compoundliteral;
  if (opt != (rtosc_print_options *)0x0) {
    opt_00 = &opt->lossless;
  }
  arg_00 = &arg->val;
  bVar17 = arg->type;
  pbVar13 = (byte *)0x0;
  local_60 = (byte *)0x0;
  local_40 = bs;
  if (bVar17 < 0x53) {
    if (bVar17 < 0x49) {
      if (bVar17 == 0x2d) {
        if (((rtosc_print_options *)opt_00)->compress_ranges == 0) {
          uStack_f0 = 0x10da9e;
          iVar2 = rtosc_arg_rep_num(arg_00);
          if (iVar2 == 0) goto LAB_0010d466;
          local_60 = (byte *)0x0;
          iVar2 = 0;
        }
        else {
LAB_0010d466:
          uStack_f0 = 0x10d46e;
          iVar2 = rtosc_arg_rep_has_delta(arg_00);
          if (iVar2 == 0) {
            uStack_f0 = 0x10dbe1;
            iVar2 = rtosc_arg_rep_num(arg_00);
            if (iVar2 != 0) {
              uStack_f0 = 0x10dbf1;
              uVar3 = rtosc_arg_rep_num(arg_00);
              uStack_f0 = 0x10dc0b;
              iVar4 = asnprintf(buffer,bs,"%dx",(ulong)uVar3);
              lVar19 = (long)iVar4;
              *cols_used = *cols_used + iVar4;
              uStack_f0 = 0x10dc33;
              sVar6 = rtosc_print_arg_val(arg + 1,buffer + lVar19,bs - lVar19,
                                          (rtosc_print_options *)opt_00,cols_used,
                                          (rtosc_arg_val_t *)0x0);
              lVar11 = (long)(int)sVar6;
              local_40 = (bs - lVar19) - lVar11;
              buffer = buffer + lVar19 + lVar11;
              local_60 = (byte *)(lVar11 + lVar19);
              uStack_f0 = 0x10dc54;
              iVar2 = rtosc_arg_rep_num(arg_00);
              goto LAB_0010def6;
            }
          }
          uStack_f0 = 0x10d47e;
          iVar2 = rtosc_arg_rep_has_delta(arg_00);
          prVar14 = arg + (ulong)(iVar2 != 0) + 1;
          uStack_f0 = 0x10d4aa;
          sVar6 = rtosc_print_arg_val(prVar14,buffer,bs,(rtosc_print_options *)opt_00,cols_used,
                                      (rtosc_arg_val_t *)0x0);
          local_60 = (byte *)(long)(int)sVar6;
          local_40 = bs - (long)local_60;
          pcVar15 = buffer + (long)local_60;
          uStack_f0 = 0x10d4c0;
          iVar2 = rtosc_arg_rep_has_delta(arg_00);
          if (iVar2 != 0) {
            uStack_f0 = 0x10d4e1;
            rtosc_arg_val_from_int((rtosc_arg_val_t *)((long)&m_one.val + 8),prVar14->type,1);
            uStack_f0 = 0x10d4f6;
            rtosc_arg_val_from_int((rtosc_arg_val_t *)((long)&second.val + 8),prVar14->type,-1);
            if ((prev_arg_if_range == (rtosc_arg_val_t *)0x0) ||
               (prev_arg_if_range->type != prVar14->type)) {
              bVar21 = false;
            }
            else {
              uStack_f0 = 0x10d518;
              iVar4 = rtosc_arg_vals_eq_single(prVar14,prev_arg_if_range,(rtosc_cmp_options *)0x0);
              bVar21 = iVar4 == 0;
            }
            uStack_f0 = 0x10dd77;
            iVar4 = rtosc_arg_vals_eq_single
                              (arg + 1,(rtosc_arg_val_t *)((long)&m_one.val + 8),
                               (rtosc_cmp_options *)0x0);
            if (iVar4 == 0) {
              uStack_f0 = 0x10dde7;
              iVar4 = rtosc_arg_vals_eq_single
                                (arg + 1,(rtosc_arg_val_t *)((long)&second.val + 8),
                                 (rtosc_cmp_options *)0x0);
              if (iVar4 == 0 || bVar21) goto LAB_0010ddfa;
            }
            else if (bVar21) {
LAB_0010ddfa:
              uStack_f0 = 0x10de05;
              iVar2 = rtosc_arg_rep_num(arg_00);
              if (iVar2 != 0) {
                uStack_f0 = 0x10de24;
                asnprintf(pcVar15,local_40," ");
                *cols_used = *cols_used + 1;
                uStack_f0 = 0x10de4c;
                rtosc_arg_val_range_arg(arg,1,(rtosc_arg_val_t *)(auStack_e8 + 8));
                uStack_f0 = 0x10de64;
                sVar6 = rtosc_print_arg_val((rtosc_arg_val_t *)(auStack_e8 + 8),pcVar15 + 1,
                                            local_40 - 1,(rtosc_print_options *)opt_00,cols_used,
                                            (rtosc_arg_val_t *)0x0);
                lVar11 = (long)(int)sVar6;
                local_40 = (local_40 - 1) - lVar11;
                pcVar15 = pcVar15 + lVar11 + 1;
                local_60 = (byte *)((long)local_60 + lVar11 + 1);
              }
            }
          }
          uStack_f0 = 0x10debe;
          asnprintf(pcVar15,local_40," ... ");
          local_40 = local_40 - 5;
          buffer = pcVar15 + 5;
          local_60 = (byte *)((long)local_60 + 5);
          *cols_used = *cols_used + 5;
          uStack_f0 = 0x10dee1;
          iVar2 = rtosc_arg_rep_num(arg_00);
          uStack_f0 = 0x10deec;
          iVar5 = rtosc_arg_rep_num(arg_00);
          iVar2 = iVar2 + -1 + (uint)(iVar5 == 0);
        }
LAB_0010def6:
        uStack_f0 = 0x10defe;
        iVar5 = rtosc_arg_rep_num(arg_00);
        if (iVar2 < iVar5) {
          pcVar15 = buffer + -1;
          iVar4 = iVar2;
          uVar3 = (uint)(cols_used != (int *)0x0);
          do {
            uStack_f0 = 0x10df38;
            iVar5 = rtosc_arg_rep_has_delta(arg_00);
            prVar14 = arg + 1;
            if (iVar5 != 0) {
              prVar14 = (rtosc_arg_val_t *)((long)&m_one.val + 8);
              uStack_f0 = 0x10df56;
              rtosc_arg_val_range_arg(arg,iVar4,prVar14);
            }
            uStack_f0 = 0x10df80;
            sVar6 = rtosc_print_arg_val(prVar14,buffer,local_40,(rtosc_print_options *)opt_00,
                                        cols_used,(rtosc_arg_val_t *)0x0);
            lVar11 = (long)(int)sVar6;
            lVar19 = local_40 - lVar11;
            pcVar16 = buffer + lVar11;
            lVar11 = (long)local_60 + lVar11;
            uVar12 = uVar3 + 1;
            if ((((rtosc_print_options *)opt_00)->linelength < *cols_used) && (0 < (int)uVar3)) {
              *pcVar15 = '\n';
              uStack_f0 = 0x10dfc9;
              memmove(pcVar15 + 5,pcVar15 + 1,sVar6 + 1);
              pcVar15[1] = ' ';
              pcVar15[2] = ' ';
              pcVar15[3] = ' ';
              pcVar15[4] = ' ';
              *cols_used = (int)sVar6 + 4;
              lVar11 = lVar11 + 4;
              pcVar16 = pcVar16 + 4;
              lVar19 = lVar19 + -4;
              uVar12 = 1;
            }
            buffer = pcVar16 + 1;
            *pcVar16 = ' ';
            local_40 = lVar19 - 1;
            local_60 = (byte *)(lVar11 + 1);
            *cols_used = *cols_used + 1;
            iVar4 = iVar4 + 1;
            uStack_f0 = 0x10e02f;
            iVar5 = rtosc_arg_rep_num(arg_00);
            pcVar15 = pcVar16;
            uVar3 = uVar12;
          } while (iVar4 < iVar5);
        }
        uStack_f0 = 0x10e04b;
        iVar5 = rtosc_arg_rep_num(arg_00);
        if (iVar2 < iVar5) {
          buffer[-1] = '\0';
          local_60._0_4_ = (int)local_60 + -1;
        }
        local_60 = (byte *)(long)(int)local_60;
      }
      else {
        local_60 = pbVar13;
        if (bVar17 != 0x46) goto LAB_0010e072;
        uStack_f0 = 0x10d3f3;
        fast_strcpy(buffer,"false",bs);
        local_60 = (byte *)0x5;
      }
    }
    else {
      if (bVar17 == 0x49) {
        pcVar15 = "inf";
      }
      else {
        local_60 = pbVar13;
        if (bVar17 != 0x4e) goto LAB_0010e072;
        pcVar15 = "nil";
      }
      uStack_f0 = 0x10d536;
      fast_strcpy(buffer,pcVar15,bs);
      local_60 = (byte *)0x3;
    }
    goto LAB_0010e070;
  }
  switch(bVar17) {
  case 0x61:
    uStack_f0 = 0x10d738;
    uVar3 = rtosc_arg_arr_len(arg_00);
    lVar11 = -((ulong)uVar3 * 0x18 + 0xf & 0xfffffffffffffff0);
    *buffer = '[';
    *cols_used = *cols_used + 1;
    *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d777;
    iVar2 = rtosc_arg_arr_len(arg_00);
    if (iVar2 == 0) {
      buffer[1] = ' ';
      *cols_used = *cols_used + 1;
      pcVar15 = buffer + 2;
      local_60 = (byte *)0x2;
    }
    else {
      pcVar15 = buffer + 1;
      *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d78d;
      iVar2 = rtosc_arg_arr_len(arg_00);
      if (iVar2 < 1) {
        local_60 = (byte *)0x1;
      }
      else {
        local_60 = (byte *)0x1;
        iVar4 = 1;
        local_64 = 1;
        local_50 = buffer + -1;
        do {
          prVar14 = arg + iVar4;
          *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d7eb;
          iVar2 = rtosc_arg_arr_len(arg_00);
          *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d809;
          iVar2 = rtosc_convert_to_range
                            (prVar14,(long)((iVar2 - iVar4) + 1),
                             (rtosc_arg_val_t *)(auStack_e8 + lVar11),(rtosc_print_options *)opt_00)
          ;
          arg_01 = (rtosc_arg_val_t *)(auStack_e8 + lVar11);
          if (iVar2 == 0) {
            arg_01 = prVar14;
          }
          prev_arg_if_range_00 = arg + (long)iVar4 + -1;
          if (iVar4 == 1) {
            prev_arg_if_range_00 = (rtosc_arg_val_t *)0x0;
          }
          *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d848;
          sVar6 = rtosc_print_arg_val(arg_01,pcVar15,local_40 - 1,(rtosc_print_options *)opt_00,
                                      cols_used,prev_arg_if_range_00);
          if (iVar2 == 0) {
            *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d85f;
            iVar2 = next_arg_offset(prVar14);
          }
          lVar19 = (long)(int)sVar6;
          local_40 = (local_40 - 1) - lVar19;
          pcVar16 = pcVar15 + lVar19;
          local_60 = local_60 + lVar19;
          if (local_64 < 1 || *cols_used <= ((rtosc_print_options *)opt_00)->linelength) {
            local_64 = local_64 + 1;
          }
          else {
            *local_50 = '\n';
            *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d8b3;
            memmove(local_50 + 5,local_50 + 1,sVar6 + 1);
            local_50[1] = ' ';
            local_50[2] = ' ';
            local_50[3] = ' ';
            local_50[4] = ' ';
            *cols_used = (int)sVar6 + 4;
            local_60 = local_60 + 4;
            pcVar16 = pcVar16 + 4;
            local_40 = local_40 - 4;
            local_64 = 1;
          }
          iVar4 = iVar4 + iVar2;
          pcVar15 = pcVar16 + 1;
          *pcVar16 = ' ';
          local_60 = local_60 + 1;
          *cols_used = *cols_used + 1;
          *(undefined8 *)(auStack_e8 + lVar11 + -8) = 0x10d915;
          iVar2 = rtosc_arg_arr_len(arg_00);
          local_50 = pcVar16;
        } while (iVar4 <= iVar2);
      }
    }
    pcVar15[-1] = ']';
    pcVar15[0] = '\0';
    *cols_used = *cols_used + 1;
    break;
  case 0x62:
    uStack_f0 = 0x10d613;
    iVar4 = asnprintf(buffer,bs,"BLOB [%d ",(ulong)(uint)arg_00->i);
    local_60 = (byte *)(long)iVar4;
    iVar4 = *cols_used + iVar4;
    *cols_used = iVar4;
    pcVar15 = buffer + (long)local_60;
    if (0 < arg_00->i) {
      lVar11 = 0;
      do {
        if (((rtosc_print_options *)opt_00)->linelength + -6 <= iVar4) {
          uStack_f0 = 0x10d66d;
          iVar4 = asnprintf(pcVar15 + -1,local_40 + 1,"\n    ");
          local_60 = local_60 + (long)iVar4 + -1;
          pcVar15 = pcVar15 + (long)iVar4 + -1;
          *cols_used = 4;
        }
        uStack_f0 = 0x10d6a7;
        asnprintf(pcVar15,local_40,"0x%02x ",(ulong)(arg->val).b.data[lVar11]);
        local_40 = local_40 - 5;
        pcVar15 = pcVar15 + 5;
        local_60 = local_60 + 5;
        iVar4 = *cols_used + 5;
        *cols_used = iVar4;
        lVar11 = lVar11 + 1;
      } while (lVar11 < (arg->val).i);
    }
    pcVar15[-1] = ']';
    break;
  case 99:
    uVar3 = arg_00->i;
    uStack_f0 = 0x10d6f6;
    uVar12 = as_escaped_char(uVar3,1);
    pcVar15 = "\\";
    if (uVar12 == 0xffffffff) {
      pcVar15 = "";
      uVar12 = uVar3;
    }
    uStack_f0 = 0x10d727;
    iVar4 = asnprintf(buffer,bs,"\'%s%c\'",pcVar15,(ulong)uVar12);
    goto LAB_0010d972;
  case 100:
  case 0x66:
    if (bVar17 == 0x66) {
      uStack_f0 = 0x10d356;
      asnprintf((char *)(m_one.val.m + 8),6,"%%#.%df",
                (ulong)(uint)((rtosc_print_options *)opt_00)->floating_point_precision);
      uStack_f0 = 0x10d376;
      iVar4 = asnprintf(buffer,bs,(char *)(m_one.val.m + 8),(double)arg_00->f);
      local_60 = (byte *)(long)iVar4;
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        uStack_f0 = 0x10d3a7;
        iVar4 = asnprintf(buffer + (long)local_60,bs - (long)local_60," (%a)",(double)arg_00->f);
        uStack_f0 = 0x10d3ba;
        sVar6 = remove_trailing_zeroes(buffer + (long)(local_60 + 2));
        local_60 = local_60 + ((long)iVar4 - sVar6);
      }
    }
    else {
      uStack_f0 = 0x10d99b;
      asnprintf((char *)(m_one.val.m + 8),8,"%%#.%dlfd",
                (ulong)(uint)((rtosc_print_options *)opt_00)->floating_point_precision);
      uStack_f0 = 0x10d9bb;
      iVar4 = asnprintf(buffer,bs,(char *)(m_one.val.m + 8),arg_00->d);
      local_60 = (byte *)(long)iVar4;
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        uStack_f0 = 0x10d9eb;
        iVar4 = asnprintf(buffer + (long)local_60,bs - (long)local_60," (%la)",arg_00->d);
        local_60 = local_60 + iVar4;
      }
    }
    break;
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto LAB_0010e072;
  case 0x68:
    uStack_f0 = 0x10d5cd;
    iVar4 = asnprintf(buffer,bs,"%ldh",arg_00->d);
    goto LAB_0010d972;
  case 0x69:
    uStack_f0 = 0x10d5ee;
    iVar4 = asnprintf(buffer,bs,"%d",(ulong)(uint)arg_00->i);
    goto LAB_0010d972;
  case 0x6d:
    iVar4 = asnprintf(buffer,bs,"MIDI [0x%02x 0x%02x 0x%02x 0x%02x]",(ulong)(arg->val).m[0],
                      (ulong)(arg->val).m[1],(ulong)(arg->val).m[2],(ulong)(arg->val).m[3]);
LAB_0010d5a4:
    local_60 = (byte *)(long)iVar4;
    break;
  case 0x72:
    uVar3 = arg_00->i;
    iVar4 = asnprintf(buffer,bs,"#%02x%02x%02x%02x",(ulong)(uVar3 >> 0x18),
                      (ulong)(uVar3 >> 0x10 & 0xff),(ulong)(uVar3 >> 8 & 0xff),(ulong)(uVar3 & 0xff)
                     );
LAB_0010d972:
    local_60 = (byte *)(long)iVar4;
    break;
  case 0x73:
switchD_0010d327_caseD_73:
    *buffer = '\"';
    *cols_used = *cols_used + 1;
    pbVar13 = (byte *)arg_00->s;
    uVar18 = (ulong)*pbVar13;
    bVar21 = false;
    local_60 = (byte *)(buffer + 1);
LAB_0010dc60:
    bVar17 = (byte)uVar18;
    while (bVar17 != 0) {
      bVar17 = (byte)uVar18;
      if ((!bVar21) && (((rtosc_print_options *)opt_00)->linelength + -3 < *cols_used)) {
        uStack_f0 = 0x10dc99;
        iVar4 = asnprintf((char *)local_60,bs,"\"\\\n    \"");
        local_60 = local_60 + iVar4;
        *cols_used = 5;
        bVar17 = *pbVar13;
      }
      uStack_f0 = 0x10dcb4;
      iVar4 = as_escaped_char((int)(char)bVar17,0);
      if (iVar4 == -1) {
        *local_60 = bVar17;
        local_60 = local_60 + 1;
        iVar4 = *cols_used + 1;
LAB_0010dd0a:
        *cols_used = iVar4;
      }
      else {
        *local_60 = 0x5c;
        local_60[1] = (byte)iVar4;
        *cols_used = *cols_used + 2;
        local_60 = local_60 + 2;
        if (iVar4 == 0x6e && !bVar21) {
          uStack_f0 = 0x10dcee;
          iVar4 = asnprintf((char *)local_60,bs,"\"\\\n    \"");
          local_60 = local_60 + iVar4;
          iVar4 = 5;
          goto LAB_0010dd0a;
        }
      }
      bVar17 = pbVar13[1];
      uVar18 = (ulong)bVar17;
      pbVar13 = pbVar13 + 1;
    }
    if (!bVar21) {
      *local_60 = 0x22;
      *cols_used = *cols_used + 1;
      if (arg->type == 'S') {
        local_60[1] = 0x53;
        local_60 = local_60 + 2;
      }
      else {
        local_60 = local_60 + 1;
      }
    }
    *local_60 = 0;
    local_60 = local_60 + -(long)buffer;
    break;
  case 0x74:
    uStack_f0 = 0x10d54d;
    _Var1 = rtosc_arg_val_is_immediatelly(arg);
    if (_Var1) {
      uStack_f0 = 0x10d56b;
      iVar4 = asnprintf(buffer,bs,"immediately");
      goto LAB_0010d5a4;
    }
    uStack_f0 = 0x10dac4;
    __tp = rtosc_params_from_arg_val(arg);
    uStack_f0 = 0x10dacf;
    uVar8 = rtosc_secfracs_from_arg_val(arg);
    if ((int)uVar8 == 0) {
      if (__tp->tm_sec == 0) {
        if (__tp->tm_hour == 0) {
          pcVar15 = "%Y-%m-%d %H:%M";
          if (__tp->tm_min == 0) {
            pcVar15 = "%Y-%m-%d";
          }
        }
        else {
          pcVar15 = "%Y-%m-%d %H:%M";
        }
      }
      else {
        pcVar15 = "%Y-%m-%d %H:%M:%S";
      }
      uStack_f0 = 0x10e0dc;
      local_60 = (byte *)strftime(buffer,bs,pcVar15,(tm *)__tp);
    }
    else {
      uStack_f0 = 0x10dafc;
      sVar9 = strftime(buffer,bs,"%Y-%m-%d %H:%M:%S",(tm *)__tp);
      uVar3 = ((rtosc_print_options *)opt_00)->floating_point_precision;
      uStack_f0 = 0x10db12;
      fVar22 = rtosc_secfracs2float((long)(int)uVar8);
      uStack_f0 = 0x10db37;
      asnprintf((char *)(m_one.val.m + 8),5,"%%.%df",(ulong)uVar3);
      uStack_f0 = 0x10db58;
      iVar4 = asnprintf(buffer + sVar9,bs - sVar9,(char *)(m_one.val.m + 8));
      pcVar16 = buffer + (int)sVar9;
      uStack_f0 = 0x10db71;
      pcVar15 = strchr(pcVar16,0x2e);
      uStack_f0 = 0x10db7c;
      sVar10 = strlen(pcVar15);
      uStack_f0 = 0x10db8b;
      memmove(pcVar16,pcVar15,sVar10 + 1);
      local_60 = (byte *)(pcVar16 + (((long)iVar4 + sVar9) - (long)pcVar15));
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        uStack_f0 = 0x10dbb7;
        iVar4 = asnprintf(buffer + (long)local_60,bs - (long)local_60," (...+%as)",(double)fVar22);
        uStack_f0 = 0x10dbca;
        sVar6 = remove_trailing_zeroes(buffer + (long)(local_60 + 6));
        local_60 = local_60 + ((long)iVar4 - sVar6);
      }
    }
    break;
  default:
    if (bVar17 == 0x53) {
      pbVar13 = (byte *)arg_00->s;
      uVar18 = (ulong)(char)*pbVar13;
      if (uVar18 != 0x5f) {
        uStack_f0 = 0x10da0b;
        ppuVar7 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar7 + uVar18 * 2 + 1) & 4) == 0) goto switchD_0010d327_caseD_73;
      }
      bVar17 = pbVar13[1];
      bVar21 = true;
      local_60 = (byte *)buffer;
      if (bVar17 != 0) {
        pbVar20 = pbVar13 + 1;
        do {
          while (bVar17 != 0x5f) {
            uStack_f0 = 0x10da46;
            ppuVar7 = __ctype_b_loc();
            lVar11 = (long)(char)bVar17;
            bVar17 = pbVar20[1];
            if ((bVar17 == 0) || (pbVar20 = pbVar20 + 1, ((*ppuVar7)[lVar11] & 8) == 0)) {
              if (((*ppuVar7)[lVar11] & 8) == 0) goto switchD_0010d327_caseD_73;
              goto LAB_0010dc60;
            }
          }
          bVar17 = pbVar20[1];
          pbVar20 = pbVar20 + 1;
        } while (bVar17 != 0);
      }
      goto LAB_0010dc60;
    }
    local_60 = pbVar13;
    if (bVar17 != 0x54) goto LAB_0010e072;
    uStack_f0 = 0x10d449;
    fast_strcpy(buffer,"true",bs);
    local_60 = (byte *)0x4;
  }
LAB_0010e070:
  bVar17 = arg->type;
LAB_0010e072:
  if (((0x20 < bVar17 - 0x53) || ((0x10000c001U >> ((ulong)(bVar17 - 0x53) & 0x3f) & 1) == 0)) &&
     (bVar17 != 0x2d)) {
    *cols_used = *cols_used + (int)local_60;
  }
  return (size_t)local_60;
}

Assistant:

size_t rtosc_print_arg_val(const rtosc_arg_val_t *arg,
                           char *buffer, size_t bs,
                           const rtosc_print_options* opt, int *cols_used, const rtosc_arg_val_t* prev_arg_if_range)
{
    size_t wrt = 0;
    if(!opt)
        opt = default_print_options;
    assert(arg);
    const rtosc_arg_t* val = &arg->val;

    switch(arg->type)
    {
        case 'T':
            assert(bs>4);
            fast_strcpy(buffer, "true", bs);
            wrt = 4;
            break;
        case 'F':
            assert(bs>5);
            fast_strcpy(buffer, "false", bs);
            wrt = 5;
            break;
        case 'N':
            assert(bs>3);
            fast_strcpy(buffer, "nil", bs);
            wrt = 3;
            break;
        case 'I':
            assert(bs>3);
            fast_strcpy(buffer, "inf", bs);
            wrt = 3;
            break;
        case 'h':
            wrt = asnprintf(buffer, bs, "%"PRId64"h", val->h);
            break;
        case 't': // write to ISO 8601 date
        {
            if(rtosc_arg_val_is_immediatelly(arg))
                wrt = asnprintf(buffer, bs, "immediately");
            else
            {
                struct tm* m_tm = rtosc_params_from_arg_val(arg);
                int32_t secfracs = rtosc_secfracs_from_arg_val(arg);

                const char* strtimefmt = (secfracs || m_tm->tm_sec)
                                  ? "%Y-%m-%d %H:%M:%S"
                                  : (m_tm->tm_hour || m_tm->tm_min)
                                    ? "%Y-%m-%d %H:%M"
                                    : "%Y-%m-%d";

                wrt = strftime(buffer, bs, strtimefmt, m_tm);
                assert(wrt);

                if(secfracs)
                {
                    int prec = opt->floating_point_precision;
                    assert(prec>=0);
                    assert(prec<100);

                    // convert fractions -> float
                    float flt = rtosc_secfracs2float(secfracs);

                    // append float
                    char fmtstr[8];
                    asnprintf(fmtstr, 5, "%%.%df", prec);
                    int lastwrt = wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     fmtstr, flt);
                    // snip part before separator
                    const char* sep = strchr(buffer + lastwrt, '.');
                    assert(sep);
                    memmove(buffer + lastwrt, sep, strlen(sep)+1);
                    wrt -= (sep - (buffer + lastwrt));

                    if(opt->lossless) {
                        char* last_pos = buffer + wrt;
                        wrt += asnprintf(buffer + wrt, bs - wrt,
                                         " (...+%as)", flt);
                        wrt -= remove_trailing_zeroes(last_pos+6);
                    }
                } // if secfracs
            } // else
            break;
        }
        case 'r':
            wrt = asnprintf(buffer, bs, "#%02x%02x%02x%02x",
                      (val->i >> 24) & 0xff,
                      (val->i >> 16) & 0xff,
                      (val->i >>  8) & 0xff,
                       val->i        & 0xff
                      );
            break;
        case 'd':
        case 'f':
        {
            int prec = opt->floating_point_precision;
            assert(prec>=0);
            assert(prec<100);
            char fmtstr[9];
            if(arg->type == 'f')
            {
                // e.g. "%.42f" or "%.0f.":
                asnprintf(fmtstr, 6, "%%#.%df", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->f);
                if(opt->lossless)
                {
                    char* last_pos = buffer + wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%a)", val->f);
                    wrt -= remove_trailing_zeroes(last_pos+2);
                }
            }
            else
            {
                // e.g. "%.42lfd" or "%.0lf.d"
                asnprintf(fmtstr, 8, "%%#.%dlfd", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->d);
                if(opt->lossless)
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%la)", val->d);
            }
            break;
        }
        case 'c':
        {
            int is_esc = (as_escaped_char(val->i, true) != -1);
            wrt = asnprintf(buffer, bs, "'%s%c'",
                            is_esc ? "\\" : "",
                            is_esc ? as_escaped_char(val->i, true)
                                   : val->i);
            break;
        }
        case 'i':
            wrt = asnprintf(buffer, bs, "%"PRId32, val->i);
            break;
        case 'm':
            wrt = asnprintf(buffer, bs, "MIDI [0x%02x 0x%02x 0x%02x 0x%02x]",
                            val->m[0], val->m[1], val->m[2], val->m[3]);
            break;
        case 's':
        case 'S':
        {
            bool plain; // e.g. without quotes
            if(arg->type == 'S')
            {
                plain = true; // "Symbol": are quotes required?
                if(*val->s != '_' && !isalpha(*val->s))
                    plain = false;
                else for(const char* s = val->s + 1; *s && plain; ++s)
                    plain = (*s == '_' || (isalnum(*s)));
            }
            else plain = false;

            char* b = buffer;
            if(!plain)
            {
                *b++ = '"';
                ++*cols_used;
            }
            for(const char* s = val->s; *s; ++s)
            {
                // "3": 2 quote signs and escaping backslash
                if(!plain && *cols_used > opt->linelength - 3)
                    break_string(&b, bs, cols_used);
                assert(bs);
                int as_esc = as_escaped_char(*s, false);
                if(as_esc != -1) {
                    assert(bs-1);
                    *b++ = '\\';
                    *b++ = as_esc;
                    *cols_used += 2;
                    if(!plain && as_esc == 'n')
                        break_string(&b, bs, cols_used);
                }
                else {
                    *b++ = *s;
                    ++*cols_used;
                }
            }

            if(plain)
                assert(bs);
            else
            {
                assert(bs >= 2);
                *b++ = '"';
                ++*cols_used;
                if(arg->type == 'S') {
                    assert(bs >= 2);
                    *b++ = 'S';
                }
            }
            *b = 0;
            wrt += (b-buffer);
            break;
        }
        case 'b':
            wrt = asnprintf(buffer, bs, "BLOB [%d ", val->b.len);
            *cols_used += wrt;
            buffer += wrt;
            for(int32_t i = 0; i < val->b.len; ++i)
            {
                if(*cols_used >= opt->linelength - 6)
                {
                    int tmp = asnprintf(buffer-1, bs+1, "\n    ");
                    wrt += (tmp-1);
                    buffer += (tmp-1);
                    *cols_used = 4;
                }
                asnprintf(buffer, bs, "0x%02x ", val->b.data[i]);
                COUNT_UP_COL(5);
            }
            buffer[-1] = ']';
            break;
        case 'a':
        {
            char* last_sep = buffer - 1;
            int args_written_this_line = (cols_used) ? 1 : 0;
            STACKALLOC(rtosc_arg_val_t, args_converted, rtosc_arg_arr_len(val)); // range conversion

            COUNT_UP_WRITE('[');
            if(rtosc_arg_arr_len(val))
            for(int32_t i = 1; i <= rtosc_arg_arr_len(val); )
            {
                int32_t conv = rtosc_convert_to_range(arg+i, rtosc_arg_arr_len(val)+1-i, args_converted, opt);
                const rtosc_arg_val_t* input = conv ? args_converted : arg+i;

                size_t tmp = rtosc_print_arg_val(input, buffer, bs,
                                                 opt, cols_used, (i == 1) ? NULL : arg + i -1);
                i += conv ? conv : next_arg_offset(arg+i);
                COUNT_UP(tmp);

                linebreak_check_after_write(cols_used, &wrt,
                                            last_sep, &buffer, &bs,
                                            tmp, &args_written_this_line,
                                            opt->linelength);

                last_sep = buffer;
                COUNT_UP_WRITE(' ');
            }
            else
                COUNT_UP_WRITE(' ');

            assert(bs);
            buffer[-1] = ']';
            *buffer = 0;
            ++*cols_used;
            --bs;
            break;
        }
        case '-':
        {
            wrt += rtosc_print_range(arg, buffer, bs, opt, cols_used, prev_arg_if_range);
            break;
        }
        default:
            ;
    }

    switch(arg->type)
    {
        case '-':
        case 'a':
        case 's':
        case 'S':
        case 'b':
            // these can break the line, so they compute *cols_used themselves
            break;
        default:
            *cols_used += wrt;
    }

    return wrt;
}